

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::sum(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  bool bVar2;
  Node local_150;
  Node local_110;
  undefined1 local_d0 [96];
  undefined1 local_70 [8];
  Node tNode;
  nodekind local_20;
  nodekind kind;
  Parser *this_local;
  Node *termNode;
  
  term(__return_storage_ptr__,this);
  while( true ) {
    lVar1 = getLexemType(this);
    bVar2 = true;
    if (lVar1 != PLUS) {
      lVar1 = getLexemType(this);
      bVar2 = true;
      if (lVar1 != MINUS) {
        lVar1 = getLexemType(this);
        bVar2 = true;
        if (lVar1 != MULTIPLICATION) {
          lVar1 = getLexemType(this);
          bVar2 = lVar1 == DIVISION;
        }
      }
    }
    if (!bVar2) break;
    lVar1 = getLexemType(this);
    switch(lVar1) {
    case PLUS:
      local_20 = ADD;
      break;
    case MINUS:
      local_20 = SUB;
      break;
    case MULTIPLICATION:
      local_20 = MUL;
      break;
    case DIVISION:
      local_20 = DIV;
    }
    Node::Node((Node *)local_70,__return_storage_ptr__);
    getLexemValue_abi_cxx11_((Parser *)local_d0);
    Node::Node((Node *)(local_d0 + 0x20),local_20,(string *)local_d0);
    Node::operator=(__return_storage_ptr__,(Node *)(local_d0 + 0x20));
    Node::~Node((Node *)(local_d0 + 0x20));
    std::__cxx11::string::~string((string *)local_d0);
    nextLexem(this);
    Node::Node(&local_110,(Node *)local_70);
    Node::addSubnode(__return_storage_ptr__,&local_110);
    Node::~Node(&local_110);
    term(&local_150,this);
    Node::addSubnode(__return_storage_ptr__,&local_150);
    Node::~Node(&local_150);
    Node::~Node((Node *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::sum() {
    Node termNode = term(); // sumNode = var
    nodekind kind;
    while (getLexemType() == PLUS || getLexemType() == MINUS || getLexemType() == MULTIPLICATION
           || getLexemType() == DIVISION) {
        switch (getLexemType()) {
            case PLUS:
                kind = ADD;
                break;
            case MINUS:
                kind = SUB;
                break;
            case MULTIPLICATION:
                kind = MUL;
                break;
            case DIVISION:
                kind = DIV;
                break;
        }
        Node tNode = Node(termNode);
        termNode = Node(kind, getLexemValue());
        nextLexem();
        termNode.addSubnode(tNode);
        termNode.addSubnode(term());
    }
    return termNode;
}